

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_port.h
# Opt level: O0

void __thiscall
sc_core::sc_port<sc_core::sc_event_queue_if,_1,_(sc_core::sc_port_policy)0>::sc_port
          (sc_port<sc_core::sc_event_queue_if,_1,_(sc_core::sc_port_policy)0> *this,
          sc_event_queue_if *interface_)

{
  socklen_t __len;
  sockaddr *__addr;
  sc_port_b<sc_core::sc_event_queue_if> *in_RSI;
  sc_port_b<sc_core::sc_event_queue_if> *in_RDI;
  sc_port_policy in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int __fd;
  
  sc_port_b<sc_core::sc_event_queue_if>::sc_port_b
            (in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  __fd = (int)in_RSI;
  __len = 0x35dc68;
  (in_RDI->super_sc_port_base).super_sc_object._vptr_sc_object = (_func_int **)&PTR_print_0035dc68;
  sc_warn_port_constructor();
  sc_port_b<sc_core::sc_event_queue_if>::bind(in_RDI,__fd,__addr,__len);
  return;
}

Assistant:

explicit sc_port( IF& interface_ )
	: base_type( N, P )
	{ sc_warn_port_constructor(); base_type::bind( interface_ ); }